

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O1

void zhash_map_values(zhash_t *zh,_func_void_varargs *f)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  zhash_t *zh_1;
  char *unaff_R15;
  
  if (zh == (zhash_t *)0x0) {
    __assert_fail("zh != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zhash.c"
                  ,0x185,"void zhash_map_values(zhash_t *, void (*)())");
  }
  if (f == (_func_void_varargs *)0x0) {
    return;
  }
  iVar5 = -1;
  do {
    iVar1 = zh->nentries;
    iVar2 = iVar5 + 1;
    if (iVar5 + 1 < iVar1) {
      iVar2 = iVar1;
    }
    do {
      iVar4 = iVar5;
      iVar5 = iVar2 + -1;
      if (iVar2 + -1 == iVar4) goto LAB_00404e8c;
      iVar5 = iVar4 + 1;
      lVar3 = (long)iVar5 * (long)zh->entrysz;
    } while (zh->entries[lVar3] == '\0');
    unaff_R15 = zh->entries + (long)(int)lVar3 + zh->keysz + 1;
LAB_00404e8c:
    if (iVar1 <= iVar4 + 1) {
      return;
    }
    (*f)(unaff_R15);
  } while( true );
}

Assistant:

void zhash_map_values(zhash_t * zh, void (*f)())
{
    assert(zh != NULL);
    if (f == NULL)
        return;

    zhash_iterator_t itr;
    zhash_iterator_init(zh, &itr);

    void *key, *value;
    while(zhash_iterator_next_volatile(&itr, &key, &value)) {
        f(value);
    }
}